

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O0

void __thiscall
sf::Window::create(Window *this,VideoMode mode,String *title,Uint32 style,ContextSettings *settings)

{
  undefined4 uVar1;
  undefined4 uVar2;
  VideoMode mode_00;
  bool bVar3;
  WindowBase *pWVar4;
  ostream *poVar5;
  vector<sf::VideoMode,_std::allocator<sf::VideoMode>_> *this_00;
  const_reference pvVar6;
  WindowImpl *pWVar7;
  GlContext *pGVar8;
  ContextSettings *in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  WindowBase *in_RDI;
  uint in_R8D;
  VideoMode *in_R9;
  uint unaff_retaddr;
  uint unaff_retaddr_00;
  WindowImpl *in_stack_00000008;
  ContextSettings *in_stack_00000010;
  undefined4 in_stack_ffffffffffffffa0;
  Uint32 style_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar9;
  undefined4 local_c;
  
  local_c = (undefined4)in_RSI;
  uVar2 = (undefined4)((ulong)in_RSI >> 0x20);
  pWVar4 = in_RDI;
  uVar9 = local_c;
  (*in_RDI->_vptr_WindowBase[4])();
  style_00 = (Uint32)((ulong)pWVar4 >> 0x20);
  if ((in_R8D & 8) != 0) {
    pWVar4 = WindowBase::getFullscreenWindow(in_RDI);
    if (pWVar4 == (WindowBase *)0x0) {
      bVar3 = VideoMode::isValid(in_R9);
      if (!bVar3) {
        poVar5 = err();
        poVar5 = std::operator<<(poVar5,
                                 "The requested video mode is not available, switching to a valid mode"
                                );
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        this_00 = VideoMode::getFullscreenModes();
        pvVar6 = std::vector<sf::VideoMode,_std::allocator<sf::VideoMode>_>::operator[](this_00,0);
        uVar1 = pvVar6->width;
        uVar2 = pvVar6->height;
        in_EDX = pvVar6->bitsPerPixel;
        local_c = uVar1;
      }
      WindowBase::setFullscreenWindow(in_RDI,in_RDI);
    }
    else {
      poVar5 = err();
      poVar5 = std::operator<<(poVar5,
                               "Creating two fullscreen windows is not allowed, switching to windowed mode"
                              );
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  mode_00.height = in_EDX;
  mode_00.width = uVar2;
  mode_00.bitsPerPixel = unaff_retaddr;
  pWVar7 = priv::WindowImpl::create
                     (mode_00,(String *)CONCAT44(uVar9,in_stack_ffffffffffffffe0),style_00,in_RCX);
  in_RDI->m_impl = pWVar7;
  pGVar8 = priv::GlContext::create(in_stack_00000010,in_stack_00000008,unaff_retaddr_00);
  in_RDI[1]._vptr_WindowBase = (_func_int **)pGVar8;
  initialize((Window *)CONCAT44(local_c,in_stack_ffffffffffffffa0));
  return;
}

Assistant:

void Window::create(VideoMode mode, const String& title, Uint32 style, const ContextSettings& settings)
{
    // Destroy the previous window implementation
    close();

    // Fullscreen style requires some tests
    if (style & Style::Fullscreen)
    {
        // Make sure there's not already a fullscreen window (only one is allowed)
        if (getFullscreenWindow())
        {
            err() << "Creating two fullscreen windows is not allowed, switching to windowed mode" << std::endl;
            style &= ~static_cast<Uint32>(Style::Fullscreen);
        }
        else
        {
            // Make sure that the chosen video mode is compatible
            if (!mode.isValid())
            {
                err() << "The requested video mode is not available, switching to a valid mode" << std::endl;
                mode = VideoMode::getFullscreenModes()[0];
            }

            // Update the fullscreen window
            setFullscreenWindow(this);
        }
    }

    // Check validity of style according to the underlying platform
    #if defined(SFML_SYSTEM_IOS) || defined(SFML_SYSTEM_ANDROID)
        if (style & Style::Fullscreen)
            style &= ~static_cast<Uint32>(Style::Titlebar);
        else
            style |= Style::Titlebar;
    #else
        if ((style & Style::Close) || (style & Style::Resize))
            style |= Style::Titlebar;
    #endif

    // Recreate the window implementation
    m_impl = priv::WindowImpl::create(mode, title, style, settings);

    // Recreate the context
    m_context = priv::GlContext::create(settings, m_impl, mode.bitsPerPixel);

    // Perform common initializations
    initialize();
}